

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

void __thiscall
btQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb
          (btQuantizedBvh *this,btQuantizedBvhNode *currentNode,btNodeOverlapCallback *nodeCallback,
          unsigned_short *quantizedQueryAabbMin,unsigned_short *quantizedQueryAabbMax)

{
  uint uVar1;
  btQuantizedBvhNode *pbVar2;
  btQuantizedBvhNode *pbVar3;
  
  while ((((*quantizedQueryAabbMin <= currentNode->m_quantizedAabbMax[0] &&
           (currentNode->m_quantizedAabbMin[0] <= *quantizedQueryAabbMax)) &&
          (quantizedQueryAabbMin[2] <= currentNode->m_quantizedAabbMax[2])) &&
         (((currentNode->m_quantizedAabbMin[2] <= quantizedQueryAabbMax[2] &&
           (quantizedQueryAabbMin[1] <= currentNode->m_quantizedAabbMax[1])) &&
          (currentNode->m_quantizedAabbMin[1] <= quantizedQueryAabbMax[1]))))) {
    uVar1 = currentNode->m_escapeIndexOrTriangleIndex;
    if (-1 < (int)uVar1) {
      (*nodeCallback->_vptr_btNodeOverlapCallback[2])
                (nodeCallback,(ulong)(uVar1 >> 0x15),(ulong)(uVar1 & 0x1fffff));
      return;
    }
    walkRecursiveQuantizedTreeAgainstQueryAabb
              (this,currentNode + 1,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
    pbVar2 = currentNode + 1;
    pbVar3 = currentNode + (ulong)(uint)-pbVar2->m_escapeIndexOrTriangleIndex + 1;
    currentNode = currentNode + 2;
    if (pbVar2->m_escapeIndexOrTriangleIndex < 0) {
      currentNode = pbVar3;
    }
  }
  return;
}

Assistant:

void btQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb(const btQuantizedBvhNode* currentNode,btNodeOverlapCallback* nodeCallback,unsigned short int* quantizedQueryAabbMin,unsigned short int* quantizedQueryAabbMax) const
{
	btAssert(m_useQuantization);
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	//PCK: unsigned instead of bool
	aabbOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,currentNode->m_quantizedAabbMin,currentNode->m_quantizedAabbMax);
	isLeafNode = currentNode->isLeafNode();
		
	//PCK: unsigned instead of bool
	if (aabbOverlap != 0)
	{
		if (isLeafNode)
		{
			nodeCallback->processNode(currentNode->getPartId(),currentNode->getTriangleIndex());
		} else
		{
			//process left and right children
			const btQuantizedBvhNode* leftChildNode = currentNode+1;
			walkRecursiveQuantizedTreeAgainstQueryAabb(leftChildNode,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);

			const btQuantizedBvhNode* rightChildNode = leftChildNode->isLeafNode() ? leftChildNode+1:leftChildNode+leftChildNode->getEscapeIndex();
			walkRecursiveQuantizedTreeAgainstQueryAabb(rightChildNode,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
		}
	}		
}